

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O3

void Abc_NtkTrasferNames(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkNew)

{
  undefined8 *puVar1;
  Abc_Obj_t *pAVar2;
  long *plVar3;
  int iVar4;
  char *pcVar5;
  Vec_Ptr_t *pVVar6;
  int *piVar7;
  undefined8 *puVar8;
  long lVar9;
  
  if (pNtk->vPis->nSize != pNtkNew->vPis->nSize) {
    __assert_fail("Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                  ,0x90,"void Abc_NtkTrasferNames(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk->vPos->nSize != pNtkNew->vPos->nSize) {
    __assert_fail("Abc_NtkPoNum(pNtk) == Abc_NtkPoNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                  ,0x91,"void Abc_NtkTrasferNames(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk->vBoxes->nSize != pNtkNew->vBoxes->nSize) {
    __assert_fail("Abc_NtkBoxNum(pNtk) == Abc_NtkBoxNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                  ,0x92,"void Abc_NtkTrasferNames(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar4 = Nm_ManNumEntries(pNtk->pManName);
  if (iVar4 < 1) {
    __assert_fail("Nm_ManNumEntries(pNtk->pManName) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                  ,0x93,"void Abc_NtkTrasferNames(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar4 = Nm_ManNumEntries(pNtkNew->pManName);
  if (iVar4 != 0) {
    __assert_fail("Nm_ManNumEntries(pNtkNew->pManName) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                  ,0x94,"void Abc_NtkTrasferNames(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  pVVar6 = pNtk->vCis;
  if (0 < pVVar6->nSize) {
    lVar9 = 0;
    do {
      puVar1 = (undefined8 *)pVVar6->pArray[lVar9];
      piVar7 = (int *)*puVar1;
      puVar8 = puVar1;
      if (*piVar7 == 1) {
        puVar8 = *(undefined8 **)
                  (*(long *)(*(long *)(piVar7 + 8) + 8) + (long)*(int *)puVar1[6] * 8);
        piVar7 = (int *)*puVar8;
      }
      pAVar2 = (Abc_Obj_t *)puVar1[8];
      pcVar5 = Nm_ManCreateUniqueName(*(Nm_Man_t **)(piVar7 + 6),*(int *)(puVar8 + 2));
      Abc_ObjAssignName(pAVar2,pcVar5,(char *)0x0);
      lVar9 = lVar9 + 1;
      pVVar6 = pNtk->vCis;
    } while (lVar9 < pVVar6->nSize);
  }
  pVVar6 = pNtk->vCos;
  if (0 < pVVar6->nSize) {
    lVar9 = 0;
    do {
      puVar1 = (undefined8 *)pVVar6->pArray[lVar9];
      piVar7 = (int *)*puVar1;
      puVar8 = puVar1;
      if (*piVar7 == 1) {
        puVar8 = *(undefined8 **)
                  (*(long *)(*(long *)(piVar7 + 8) + 8) + (long)*(int *)puVar1[4] * 8);
        piVar7 = (int *)*puVar8;
      }
      pAVar2 = (Abc_Obj_t *)puVar1[8];
      pcVar5 = Nm_ManCreateUniqueName(*(Nm_Man_t **)(piVar7 + 6),*(int *)(puVar8 + 2));
      Abc_ObjAssignName(pAVar2,pcVar5,(char *)0x0);
      lVar9 = lVar9 + 1;
      pVVar6 = pNtk->vCos;
    } while (lVar9 < pVVar6->nSize);
  }
  pVVar6 = pNtk->vBoxes;
  if (0 < pVVar6->nSize) {
    lVar9 = 0;
    do {
      plVar3 = (long *)pVVar6->pArray[lVar9];
      pAVar2 = (Abc_Obj_t *)plVar3[8];
      pcVar5 = Nm_ManCreateUniqueName(*(Nm_Man_t **)(*plVar3 + 0x18),(int)plVar3[2]);
      Abc_ObjAssignName(pAVar2,pcVar5,(char *)0x0);
      lVar9 = lVar9 + 1;
      pVVar6 = pNtk->vBoxes;
    } while (lVar9 < pVVar6->nSize);
  }
  return;
}

Assistant:

void Abc_NtkTrasferNames( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkNew )
{
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkNew) );
    assert( Abc_NtkPoNum(pNtk) == Abc_NtkPoNum(pNtkNew) );
    assert( Abc_NtkBoxNum(pNtk) == Abc_NtkBoxNum(pNtkNew) );
    assert( Nm_ManNumEntries(pNtk->pManName) > 0 );
    assert( Nm_ManNumEntries(pNtkNew->pManName) == 0 );
    // copy the CI/CO/box names
    Abc_NtkForEachCi( pNtk, pObj, i )
        Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(Abc_ObjFanout0Ntk(pObj)), NULL );
    Abc_NtkForEachCo( pNtk, pObj, i ) 
        Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(Abc_ObjFanin0Ntk(pObj)), NULL );
    Abc_NtkForEachBox( pNtk, pObj, i ) 
        Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), NULL );
}